

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::prepare(WasmBinaryWriter *this)

{
  pointer pHVar1;
  pointer pHVar2;
  Module *wasm;
  ImportInfo *__ptr;
  HeapTypeKind HVar3;
  ulong uVar4;
  ImportInfo *this_00;
  long lVar5;
  __hashtable *__h;
  ulong uVar6;
  Signature local_88;
  pointer local_78;
  undefined1 local_70 [64];
  
  wasm::ModuleUtils::getOptimizedIndexedHeapTypes((IndexedHeapTypes *)&local_88,this->wasm);
  pHVar1 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar2 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->indexedTypes).types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_88.params.id;
  (this->indexedTypes).types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_88.results.id;
  (this->indexedTypes).types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
  local_88 = (Signature)ZEXT816(0);
  local_78 = (pointer)0x0;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1,(long)pHVar2 - (long)pHVar1);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(this->indexedTypes).indices._M_h,local_70);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_70);
  if (local_88.params.id != 0) {
    operator_delete((void *)local_88.params.id,(long)local_78 - local_88.params.id);
  }
  uVar4 = (ulong)((long)(this->indexedTypes).types.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->indexedTypes).types.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar4 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      HVar3 = HeapType::getKind((HeapType *)
                                ((long)&((this->indexedTypes).types.
                                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->id + lVar5));
      if (HVar3 == Func) {
        local_88 = HeapType::getSignature
                             ((HeapType *)
                              ((long)&((this->indexedTypes).types.
                                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->id + lVar5));
        local_78 = (pointer)CONCAT44(local_78._4_4_,(int)uVar6);
        std::
        _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,unsigned_int>,std::allocator<std::pair<wasm::Signature_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<wasm::Signature_const,unsigned_int>>
                  ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,unsigned_int>,std::allocator<std::pair<wasm::Signature_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->signatureIndexes,&local_88);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 8;
    } while ((uVar4 & 0xffffffff) != uVar6);
  }
  wasm = this->wasm;
  this_00 = (ImportInfo *)operator_new(0x80);
  ImportInfo::ImportInfo(this_00,wasm);
  __ptr = (this->importInfo)._M_t.
          super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>._M_t.
          super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>.
          super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl;
  (this->importInfo)._M_t.
  super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>.
  super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl = this_00;
  if (__ptr != (ImportInfo *)0x0) {
    std::default_delete<wasm::ImportInfo>::operator()
              ((default_delete<wasm::ImportInfo> *)&this->importInfo,__ptr);
  }
  return;
}

Assistant:

void WasmBinaryWriter::prepare() {
  // Collect function types and their frequencies. Collect information in each
  // function in parallel, then merge.
  indexedTypes = ModuleUtils::getOptimizedIndexedHeapTypes(*wasm);
  for (Index i = 0, size = indexedTypes.types.size(); i < size; ++i) {
    if (indexedTypes.types[i].isSignature()) {
      signatureIndexes.insert({indexedTypes.types[i].getSignature(), i});
    }
  }
  importInfo = std::make_unique<ImportInfo>(*wasm);
}